

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O3

void __thiscall SceneParser::SceneParser(SceneParser *this,string *filename)

{
  int iVar1;
  long lVar2;
  FILE *pFVar3;
  Sampler *pSVar4;
  long *plVar5;
  long *plVar6;
  string ext;
  undefined1 local_b0 [16];
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_basepath)._M_dataplus._M_p = (pointer)&(this->_basepath).field_2;
  (this->_basepath)._M_string_length = 0;
  (this->_basepath).field_2._M_local_buf[0] = '\0';
  this->_file = (FILE *)0x0;
  this->_camera = (Camera *)0x0;
  Vector3f::Vector3f(&this->_background_color,0.5,0.5,0.5);
  Vector3f::Vector3f(&this->_ambient_light,0.0,0.0,0.0);
  this->_group = (Group *)0x0;
  this->_cubemap = (CubeMap *)0x0;
  (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_current_material = (Material *)0x0;
  (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_num_lights = 0;
  this->_num_materials = 0;
  (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (filename->_M_string_length == 0) {
    __assert_fail("!filename.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x23,"SceneParser::SceneParser(const std::string &)");
  }
  if (filename->_M_string_length < 5) {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"ERROR: Wrong file name extension\n","");
    std::operator<<((ostream *)&std::cout,(string *)local_90);
  }
  else {
    lVar2 = std::__cxx11::string::find_last_of((char *)filename,0x134f3d,0xffffffffffffffff);
    if (lVar2 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)&this->_basepath,0,(char *)(this->_basepath)._M_string_length,0x13318a);
    }
    else {
      std::__cxx11::string::substr((ulong)local_90,(ulong)filename);
      std::__cxx11::string::operator=((string *)&this->_basepath,(string *)local_90);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
    }
    std::__cxx11::string::substr((ulong)local_90,(ulong)filename);
    iVar1 = std::__cxx11::string::compare((char *)local_90);
    if (iVar1 == 0) {
      pFVar3 = fopen((filename->_M_dataplus)._M_p,"r");
      this->_file = (FILE *)pFVar3;
      if (pFVar3 != (FILE *)0x0) {
        parseFile(this);
        fclose((FILE *)this->_file);
        this->_file = (FILE *)0x0;
        if ((this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"WARNING: No lights specified\n",0x1d);
          Vector3f::Vector3f((Vector3f *)local_b0,1.0,1.0,1.0);
          Vector3f::operator=(&this->_ambient_light,(Vector3f *)local_b0);
        }
        pSVar4 = (Sampler *)operator_new(8);
        pSVar4->_vptr_Sampler = (_func_int **)&PTR__Sampler_0013fcc0;
        this->sampler = pSVar4;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
        return;
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Cannot open scene file ","");
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(filename->_M_dataplus)._M_p);
      local_70 = (long *)*plVar5;
      plVar6 = plVar5 + 2;
      if (local_70 == plVar6) {
        local_60 = *plVar6;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar6;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b0._0_8_ = *plVar5;
      plVar6 = plVar5 + 2;
      if ((long *)local_b0._0_8_ == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = plVar5[3];
        local_b0._0_8_ = &local_a0;
      }
      else {
        local_a0 = *plVar6;
      }
      local_b0._8_8_ = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::operator<<((ostream *)&std::cout,(string *)local_b0);
    }
    else {
      local_b0._0_8_ = &local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,"ERROR: Wrong file name extension\n","");
      std::operator<<((ostream *)&std::cout,(string *)local_b0);
    }
  }
  exit(1);
}

Assistant:

SceneParser::SceneParser(const std::string &filename) :
        _file(NULL),
        _camera(NULL),
        _background_color(0.5, 0.5, 0.5),
        _ambient_light(0, 0, 0),
        _num_lights(0),
        _num_materials(0),
        _current_material(NULL),
        _group(NULL),
        _cubemap(NULL) {
    // Parse the file.
    assert(!filename.empty());

    if (filename.size() <= 4) {
        _PostError("ERROR: Wrong file name extension\n");
    }

    size_t last_sep = filename.find_last_of("\\/");
    if (last_sep == std::string::npos) {
        _basepath = "";
    } else {
        _basepath = filename.substr(0, last_sep + 1);
    }

    std::string ext = filename.substr(filename.size() - 4, 4);
    if (ext != ".txt") {
        _PostError("ERROR: Wrong file name extension\n");
    }

    _file = fopen(filename.c_str(), "r");

    // FIXME extract base path from scene file path
    if (_file == NULL) {
        _PostError(std::string("Cannot open scene file ") + filename + "\n");
    }

    parseFile();
    fclose(_file);
    _file = NULL;

    // If no lights are specified, set ambient light to white
    // (do solid color ray casting).
    if (lights.empty()) {
        std::cerr << "WARNING: No lights specified\n";
        _ambient_light = Vector3f(1, 1, 1);
    }

    sampler = new experimental;
}